

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::detail::NonNegativeNumber::NonNegativeNumber(NonNegativeNumber *this)

{
  anon_class_1_0_00000001 local_39;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"NONNEGATIVE","");
  Validator::Validator(&this->super_Validator,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_39);
  return;
}

Assistant:

NonNegativeNumber() : Validator("NONNEGATIVE") {
        func_ = [](std::string &number_str) {
            double number;
            if(!detail::lexical_cast(number_str, number)) {
                return std::string("Failed parsing number: (") + number_str + ')';
            }
            if(number < 0) {
                return std::string("Number less than 0: (") + number_str + ')';
            }
            return std::string();
        };
    }